

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

bool __thiscall
VW::config::options_boost_po::add_if_t<std::vector<char,std::allocator<char>>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  size_t sVar1;
  element_type *peVar2;
  size_t sVar3;
  type_info *in_RSI;
  options_description *in_stack_00000010;
  shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_00000018;
  options_boost_po *in_stack_00000020;
  shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> typed;
  shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *this_00;
  type_info *__r;
  shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> local_30 [2];
  byte local_1;
  
  __r = in_RSI;
  peVar2 = std::
           __shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x160187);
  sVar1 = peVar2->m_type_hash;
  sVar3 = std::type_info::hash_code(in_RSI);
  if (sVar1 == sVar3) {
    this_00 = local_30;
    std::
    dynamic_pointer_cast<VW::config::typed_option<std::vector<char,std::allocator<char>>>,VW::config::base_option>
              ((shared_ptr<VW::config::base_option> *)__r);
    std::shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_>::
    shared_ptr(this_00,in_stack_ffffffffffffff78);
    add_to_description<std::vector<char,std::allocator<char>>>
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    std::shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_>::
    ~shared_ptr((shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *)
                0x1601f5);
    local_1 = 1;
    std::shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_>::
    ~shared_ptr((shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *)
                0x160207);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool options_boost_po::add_if_t(std::shared_ptr<base_option> opt, po::options_description& options_description)
{
  if (opt->m_type_hash == typeid(T).hash_code())
  {
    auto typed = std::dynamic_pointer_cast<typed_option<T>>(opt);
    add_to_description(typed, options_description);
    return true;
  }

  return false;
}